

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O2

void __thiscall HACD::Graph::Print(Graph *this)

{
  pointer pGVar1;
  pointer pGVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  size_t ed;
  ulong uVar6;
  size_t e;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"vertices (");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar4 = 0;
      pGVar1 = (this->m_vertices).
               super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->m_vertices).
                             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1) / 0x310);
      uVar4 = uVar4 + 1) {
    if (pGVar1[uVar4].m_deleted == false) {
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      std::operator<<(poVar3,"\t");
      for (uVar6 = 0; uVar6 < pGVar1[uVar4].m_edges.m_size; uVar6 = uVar6 + 1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"(");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3,",");
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::operator<<(poVar3,") ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"vertices (");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  lVar5 = 0;
  for (uVar4 = 0;
      pGVar2 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->m_edges).
                             super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pGVar2) / 0x30);
      uVar4 = uVar4 + 1) {
    if ((&pGVar2->m_deleted)[lVar5] == false) {
      poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
      poVar3 = std::operator<<(poVar3,"\t(");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3,") ");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    lVar5 = lVar5 + 0x30;
  }
  return;
}

Assistant:

void Graph::Print() const
	{
		std::cout << "-----------------------------" << std::endl;
        std::cout << "vertices (" << m_nV << ")" << std::endl;
        for (size_t v = 0; v < m_vertices.size(); ++v) 
		{
			const GraphVertex & currentVertex = m_vertices[v];
			if (!m_vertices[v].m_deleted)
			{

				std::cout  << currentVertex.m_name	  << "\t";
				long idEdge;
				for(size_t ed = 0; ed < currentVertex.m_edges.Size(); ++ed) 
				{
                    idEdge = currentVertex.m_edges[ed];
					std::cout  << "(" << m_edges[idEdge].m_v1 << "," << m_edges[idEdge].m_v2 << ") "; 	  
				}
				std::cout << std::endl;
			}			
		}

		std::cout << "vertices (" << m_nE << ")" << std::endl;
		for (size_t e = 0; e < m_edges.size(); ++e) 
		{
			const GraphEdge & currentEdge = m_edges[e];
			if (!m_edges[e].m_deleted)
			{
				std::cout  << currentEdge.m_name	  << "\t(" 
						   << m_edges[e].m_v1		  << "," 
						   << m_edges[e].m_v2		  << ") "<< std::endl;
			}			
		}
	}